

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

string * __thiscall test_im2col::vars_abi_cxx11_(string *__return_storage_ptr__,test_im2col *this)

{
  size_type *psVar1;
  bool bVar2;
  undefined8 uVar3;
  string *psVar4;
  char *pcVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  string __str;
  ulong *local_5d8;
  long local_5d0;
  ulong local_5c8;
  long lStack_5c0;
  ulong *local_5b8;
  long local_5b0;
  ulong local_5a8;
  long lStack_5a0;
  ulong *local_598;
  long local_590;
  ulong local_588;
  long lStack_580;
  ulong *local_578;
  long local_570;
  ulong local_568;
  long lStack_560;
  ulong *local_558;
  long local_550;
  ulong local_548;
  long lStack_540;
  ulong *local_538;
  long local_530;
  ulong local_528;
  long lStack_520;
  ulong *local_518;
  long local_510;
  ulong local_508;
  long lStack_500;
  ulong *local_4f8;
  long local_4f0;
  ulong local_4e8;
  long lStack_4e0;
  ulong *local_4d8;
  long local_4d0;
  ulong local_4c8;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  ulong *local_4b8;
  long local_4b0;
  ulong local_4a8;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  ulong *local_498;
  long local_490;
  ulong local_488;
  long lStack_480;
  ulong *local_478;
  long local_470;
  ulong local_468;
  long lStack_460;
  ulong *local_458;
  long local_450;
  ulong local_448;
  long lStack_440;
  ulong *local_438;
  long local_430;
  ulong local_428;
  long lStack_420;
  ulong *local_418;
  long local_410;
  ulong local_408;
  long lStack_400;
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8;
  long lStack_3e0;
  ulong *local_3d8;
  long local_3d0;
  ulong local_3c8;
  long lStack_3c0;
  ulong *local_3b8;
  long local_3b0;
  ulong local_3a8;
  long lStack_3a0;
  ulong *local_398;
  long local_390;
  ulong local_388;
  long lStack_380;
  ulong *local_378;
  long local_370;
  ulong local_368;
  long lStack_360;
  ulong *local_358;
  long local_350;
  ulong local_348;
  long lStack_340;
  long *local_338;
  undefined8 local_330;
  long local_328;
  undefined8 uStack_320;
  long *local_318;
  undefined8 local_310;
  long local_308;
  undefined8 uStack_300;
  long *local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  undefined8 uStack_2e0;
  long *local_2d8;
  undefined8 local_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  long *local_2b8;
  undefined8 local_2b0;
  long local_2a8;
  undefined8 uStack_2a0;
  long *local_298;
  undefined8 local_290;
  long local_288;
  undefined8 uStack_280;
  long *local_278;
  undefined8 local_270;
  long local_268;
  undefined8 uStack_260;
  long *local_258;
  undefined8 local_250;
  long local_248;
  undefined8 uStack_240;
  long *local_238;
  undefined8 local_230;
  long local_228;
  undefined8 uStack_220;
  long *local_218;
  undefined8 local_210;
  long local_208;
  undefined8 uStack_200;
  string *local_1f8;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0 [2];
  long local_1a0 [2];
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_1f8 = __return_storage_ptr__;
  pcVar5 = (char *)ggml_type_name(this->type_input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,pcVar5,(allocator<char> *)&local_598);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x158f4c);
  local_1d0 = &local_1c0;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_1c0 = *plVar8;
    lStack_1b8 = plVar6[3];
  }
  else {
    local_1c0 = *plVar8;
    local_1d0 = (long *)*plVar6;
  }
  local_1c8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_4c8 = *puVar9;
    uStack_4c0 = (undefined4)plVar6[3];
    uStack_4bc = *(undefined4 *)((long)plVar6 + 0x1c);
    local_4d8 = &local_4c8;
  }
  else {
    local_4c8 = *puVar9;
    local_4d8 = (ulong *)*plVar6;
  }
  local_4d0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar5 = (char *)ggml_type_name(this->type_kernel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,pcVar5,(allocator<char> *)&local_5b8);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x158f84);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_588 = *puVar9;
    lStack_580 = plVar6[3];
    local_598 = &local_588;
  }
  else {
    local_588 = *puVar9;
    local_598 = (ulong *)*plVar6;
  }
  local_590 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_4d8 != &local_4c8) {
    uVar10 = local_4c8;
  }
  if (uVar10 < (ulong)(local_590 + local_4d0)) {
    uVar10 = 0xf;
    if (local_598 != &local_588) {
      uVar10 = local_588;
    }
    if (uVar10 < (ulong)(local_590 + local_4d0)) goto LAB_00122d70;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_598,0,(char *)0x0,(ulong)local_4d8);
  }
  else {
LAB_00122d70:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_598);
  }
  local_338 = &local_328;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_328 = *plVar6;
    uStack_320 = puVar7[3];
  }
  else {
    local_328 = *plVar6;
    local_338 = (long *)*puVar7;
  }
  local_330 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_338);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_4a8 = *puVar9;
    uStack_4a0 = (undefined4)plVar6[3];
    uStack_49c = *(undefined4 *)((long)plVar6 + 0x1c);
    local_4b8 = &local_4a8;
  }
  else {
    local_4a8 = *puVar9;
    local_4b8 = (ulong *)*plVar6;
  }
  local_4b0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar5 = (char *)ggml_type_name(this->dst_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,pcVar5,(allocator<char> *)&local_5d8);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x158f91);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_5a8 = *puVar9;
    lStack_5a0 = plVar6[3];
    local_5b8 = &local_5a8;
  }
  else {
    local_5a8 = *puVar9;
    local_5b8 = (ulong *)*plVar6;
  }
  local_5b0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_4b8 != &local_4a8) {
    uVar10 = local_4a8;
  }
  if (uVar10 < (ulong)(local_5b0 + local_4b0)) {
    uVar10 = 0xf;
    if (local_5b8 != &local_5a8) {
      uVar10 = local_5a8;
    }
    if (uVar10 < (ulong)(local_5b0 + local_4b0)) goto LAB_00122f0f;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,(ulong)local_4b8);
  }
  else {
LAB_00122f0f:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4b8,(ulong)local_5b8);
  }
  local_318 = &local_308;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_308 = *plVar6;
    uStack_300 = puVar7[3];
  }
  else {
    local_308 = *plVar6;
    local_318 = (long *)*puVar7;
  }
  local_310 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_318);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_488 = *puVar9;
    lStack_480 = plVar6[3];
    local_498 = &local_488;
  }
  else {
    local_488 = *puVar9;
    local_498 = (ulong *)*plVar6;
  }
  local_490 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  var_to_str<long,4ul>(&local_b0,&this->ne_input);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x158f58);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_5c8 = *puVar9;
    lStack_5c0 = plVar6[3];
    local_5d8 = &local_5c8;
  }
  else {
    local_5c8 = *puVar9;
    local_5d8 = (ulong *)*plVar6;
  }
  local_5d0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_498 != &local_488) {
    uVar10 = local_488;
  }
  if (uVar10 < (ulong)(local_5d0 + local_490)) {
    uVar10 = 0xf;
    if (local_5d8 != &local_5c8) {
      uVar10 = local_5c8;
    }
    if (uVar10 < (ulong)(local_5d0 + local_490)) goto LAB_001230a1;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5d8,0,(char *)0x0,(ulong)local_498);
  }
  else {
LAB_001230a1:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_498,(ulong)local_5d8);
  }
  local_2f8 = &local_2e8;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_2e8 = *plVar6;
    uStack_2e0 = puVar7[3];
  }
  else {
    local_2e8 = *plVar6;
    local_2f8 = (long *)*puVar7;
  }
  local_2f0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_468 = *puVar9;
    lStack_460 = plVar6[3];
    local_478 = &local_468;
  }
  else {
    local_468 = *puVar9;
    local_478 = (ulong *)*plVar6;
  }
  local_470 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  var_to_str<long,4ul>(&local_d0,&this->ne_kernel);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x158f9b);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_4e8 = *puVar9;
    lStack_4e0 = plVar6[3];
    local_4f8 = &local_4e8;
  }
  else {
    local_4e8 = *puVar9;
    local_4f8 = (ulong *)*plVar6;
  }
  local_4f0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_478 != &local_468) {
    uVar10 = local_468;
  }
  if (uVar10 < (ulong)(local_4f0 + local_470)) {
    uVar10 = 0xf;
    if (local_4f8 != &local_4e8) {
      uVar10 = local_4e8;
    }
    if (uVar10 < (ulong)(local_4f0 + local_470)) goto LAB_00123247;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,(ulong)local_478);
  }
  else {
LAB_00123247:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_4f8);
  }
  local_2d8 = &local_2c8;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_2c8 = *plVar6;
    uStack_2c0 = puVar7[3];
  }
  else {
    local_2c8 = *plVar6;
    local_2d8 = (long *)*puVar7;
  }
  local_2d0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_448 = *puVar9;
    lStack_440 = plVar6[3];
    local_458 = &local_448;
  }
  else {
    local_448 = *puVar9;
    local_458 = (ulong *)*plVar6;
  }
  local_450 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  var_to_str<int>(&local_f0,&this->s0);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x158f6a);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_508 = *puVar9;
    lStack_500 = plVar6[3];
    local_518 = &local_508;
  }
  else {
    local_508 = *puVar9;
    local_518 = (ulong *)*plVar6;
  }
  local_510 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_458 != &local_448) {
    uVar10 = local_448;
  }
  if (uVar10 < (ulong)(local_510 + local_450)) {
    uVar10 = 0xf;
    if (local_518 != &local_508) {
      uVar10 = local_508;
    }
    if (uVar10 < (ulong)(local_510 + local_450)) goto LAB_001233f9;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,(ulong)local_458);
  }
  else {
LAB_001233f9:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_458,(ulong)local_518);
  }
  local_2b8 = &local_2a8;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_2a8 = *plVar6;
    uStack_2a0 = puVar7[3];
  }
  else {
    local_2a8 = *plVar6;
    local_2b8 = (long *)*puVar7;
  }
  local_2b0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_428 = *puVar9;
    lStack_420 = plVar6[3];
    local_438 = &local_428;
  }
  else {
    local_428 = *puVar9;
    local_438 = (ulong *)*plVar6;
  }
  local_430 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  var_to_str<int>(&local_110,&this->s1);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x158f6e);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_528 = *puVar9;
    lStack_520 = plVar6[3];
    local_538 = &local_528;
  }
  else {
    local_528 = *puVar9;
    local_538 = (ulong *)*plVar6;
  }
  local_530 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_438 != &local_428) {
    uVar10 = local_428;
  }
  if (uVar10 < (ulong)(local_530 + local_430)) {
    uVar10 = 0xf;
    if (local_538 != &local_528) {
      uVar10 = local_528;
    }
    if (uVar10 < (ulong)(local_530 + local_430)) goto LAB_001235ab;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_538,0,(char *)0x0,(ulong)local_438);
  }
  else {
LAB_001235ab:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_538);
  }
  local_298 = &local_288;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_288 = *plVar6;
    uStack_280 = puVar7[3];
  }
  else {
    local_288 = *plVar6;
    local_298 = (long *)*puVar7;
  }
  local_290 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_408 = *puVar9;
    lStack_400 = plVar6[3];
    local_418 = &local_408;
  }
  else {
    local_408 = *puVar9;
    local_418 = (ulong *)*plVar6;
  }
  local_410 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  var_to_str<int>(&local_130,&this->p0);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x158f72);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_548 = *puVar9;
    lStack_540 = plVar6[3];
    local_558 = &local_548;
  }
  else {
    local_548 = *puVar9;
    local_558 = (ulong *)*plVar6;
  }
  local_550 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_418 != &local_408) {
    uVar10 = local_408;
  }
  if (uVar10 < (ulong)(local_550 + local_410)) {
    uVar10 = 0xf;
    if (local_558 != &local_548) {
      uVar10 = local_548;
    }
    if (uVar10 < (ulong)(local_550 + local_410)) goto LAB_0012375d;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,(ulong)local_418);
  }
  else {
LAB_0012375d:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_418,(ulong)local_558);
  }
  local_278 = &local_268;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_268 = *plVar6;
    uStack_260 = puVar7[3];
  }
  else {
    local_268 = *plVar6;
    local_278 = (long *)*puVar7;
  }
  local_270 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_3e8 = *puVar9;
    lStack_3e0 = plVar6[3];
    local_3f8 = &local_3e8;
  }
  else {
    local_3e8 = *puVar9;
    local_3f8 = (ulong *)*plVar6;
  }
  local_3f0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  var_to_str<int>(&local_150,&this->p1);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x158f76);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_568 = *puVar9;
    lStack_560 = plVar6[3];
    local_578 = &local_568;
  }
  else {
    local_568 = *puVar9;
    local_578 = (ulong *)*plVar6;
  }
  local_570 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_3f8 != &local_3e8) {
    uVar10 = local_3e8;
  }
  if (uVar10 < (ulong)(local_570 + local_3f0)) {
    uVar10 = 0xf;
    if (local_578 != &local_568) {
      uVar10 = local_568;
    }
    if (uVar10 < (ulong)(local_570 + local_3f0)) goto LAB_001238fa;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_578,0,(char *)0x0,(ulong)local_3f8);
  }
  else {
LAB_001238fa:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_578);
  }
  local_258 = &local_248;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_248 = *plVar6;
    uStack_240 = puVar7[3];
  }
  else {
    local_248 = *plVar6;
    local_258 = (long *)*puVar7;
  }
  local_250 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_3c8 = *puVar9;
    lStack_3c0 = plVar6[3];
    local_3d8 = &local_3c8;
  }
  else {
    local_3c8 = *puVar9;
    local_3d8 = (ulong *)*plVar6;
  }
  local_3d0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  var_to_str<int>(&local_170,&this->d0);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,0x158fa6);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_348 = *puVar9;
    lStack_340 = plVar6[3];
    local_358 = &local_348;
  }
  else {
    local_348 = *puVar9;
    local_358 = (ulong *)*plVar6;
  }
  local_350 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_3d8 != &local_3c8) {
    uVar10 = local_3c8;
  }
  if (uVar10 < (ulong)(local_350 + local_3d0)) {
    uVar10 = 0xf;
    if (local_358 != &local_348) {
      uVar10 = local_348;
    }
    if (uVar10 < (ulong)(local_350 + local_3d0)) goto LAB_00123aa7;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,(ulong)local_3d8);
  }
  else {
LAB_00123aa7:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_358);
  }
  local_238 = &local_228;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_228 = *plVar6;
    uStack_220 = puVar7[3];
  }
  else {
    local_228 = *plVar6;
    local_238 = (long *)*puVar7;
  }
  local_230 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_3a8 = *puVar9;
    lStack_3a0 = plVar6[3];
    local_3b8 = &local_3a8;
  }
  else {
    local_3a8 = *puVar9;
    local_3b8 = (ulong *)*plVar6;
  }
  local_3b0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  var_to_str<int>(&local_190,&this->d1);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x158faa);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_368 = *puVar9;
    lStack_360 = plVar6[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar9;
    local_378 = (ulong *)*plVar6;
  }
  local_370 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_3b8 != &local_3a8) {
    uVar10 = local_3a8;
  }
  if (uVar10 < (ulong)(local_370 + local_3b0)) {
    uVar10 = 0xf;
    if (local_378 != &local_368) {
      uVar10 = local_368;
    }
    if (uVar10 < (ulong)(local_370 + local_3b0)) goto LAB_00123c5d;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_3b8);
  }
  else {
LAB_00123c5d:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)local_378);
  }
  local_218 = &local_208;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_208 = *plVar6;
    uStack_200 = puVar7[3];
  }
  else {
    local_208 = *plVar6;
    local_218 = (long *)*puVar7;
  }
  local_210 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_218);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_1e0 = *puVar9;
    lStack_1d8 = plVar6[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *puVar9;
    local_1f0 = (ulong *)*plVar6;
  }
  local_1e8 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  bVar2 = this->is_2D;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct((ulong)local_1b0,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b0[0],1,(uint)bVar2);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x158fae);
  psVar4 = local_1f8;
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_388 = *puVar9;
    lStack_380 = plVar6[3];
    local_398 = &local_388;
  }
  else {
    local_388 = *puVar9;
    local_398 = (ulong *)*plVar6;
  }
  local_390 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar10 = 0xf;
  if (local_1f0 != &local_1e0) {
    uVar10 = local_1e0;
  }
  if (uVar10 < (ulong)(local_390 + local_1e8)) {
    uVar10 = 0xf;
    if (local_398 != &local_388) {
      uVar10 = local_388;
    }
    if ((ulong)(local_390 + local_1e8) <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_398,0,(char *)0x0,(ulong)local_1f0);
      goto LAB_00123e6c;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_398);
LAB_00123e6c:
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  psVar1 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar1) {
    uVar3 = puVar7[3];
    (psVar4->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&psVar4->field_2 + 8) = uVar3;
  }
  else {
    (psVar4->_M_dataplus)._M_p = (pointer)*puVar7;
    (psVar4->field_2)._M_allocated_capacity = *psVar1;
  }
  psVar4->_M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_398 != &local_388) {
    operator_delete(local_398,local_388 + 1);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,local_368 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,local_348 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,local_3c8 + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578,local_568 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,local_3e8 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558,local_548 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,local_408 + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538,local_528 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_438 != &local_428) {
    operator_delete(local_438,local_428 + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_458 != &local_448) {
    operator_delete(local_458,local_448 + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,local_4e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_478 != &local_468) {
    operator_delete(local_478,local_468 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if (local_5d8 != &local_5c8) {
    operator_delete(local_5d8,local_5c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_498 != &local_488) {
    operator_delete(local_498,local_488 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,local_5a8 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,local_4a8 + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_598 != &local_588) {
    operator_delete(local_598,local_588 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,local_4c8 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  psVar4 = local_1f8;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return psVar4;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR12(type_input, type_kernel, dst_type, ne_input, ne_kernel, s0, s1, p0, p1, d0, d1, is_2D);
    }